

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_command * nk__begin(nk_context *ctx)

{
  undefined4 uVar1;
  nk_vec2 nVar2;
  undefined4 uVar3;
  void *pvVar4;
  nk_size nVar5;
  nk_window *pnVar6;
  void *pvVar7;
  nk_window *pnVar8;
  nk_cursor *img;
  nk_window *pnVar9;
  nk_size nVar10;
  nk_rect r;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x3f8c,"const struct nk_command *nk__begin(struct nk_context *)");
  }
  if (ctx->count == 0) {
    return (nk_command *)0x0;
  }
  pvVar4 = (ctx->memory).memory.ptr;
  if (ctx->build != 0) {
    pnVar8 = ctx->begin;
    goto LAB_0011f977;
  }
  img = (ctx->style).cursor_active;
  pvVar7 = pvVar4;
  if (img == (nk_cursor *)0x0) {
    img = (ctx->style).cursors[0];
    (ctx->style).cursor_active = img;
    if (img != (nk_cursor *)0x0) goto LAB_0011f859;
  }
  else {
LAB_0011f859:
    if (((ctx->input).mouse.grabbed == '\0') && ((ctx->style).cursor_visible != 0)) {
      (ctx->overlay).base = &ctx->memory;
      (ctx->overlay).use_clipping = 0;
      nVar5 = (ctx->memory).allocated;
      (ctx->overlay).begin = nVar5;
      (ctx->overlay).end = nVar5;
      (ctx->overlay).last = nVar5;
      (ctx->overlay).clip = nk_null_rect;
      nVar2 = (ctx->input).mouse.pos;
      uVar1 = (img->size).x;
      uVar3 = (img->size).y;
      r.h = (float)uVar3;
      r.w = (float)uVar1;
      r.x = nVar2.x - (img->offset).x;
      r.y = nVar2.y - (img->offset).y;
      nk_draw_image(&ctx->overlay,r,&img->img,(nk_color)0xffffffff);
      pvVar7 = (ctx->memory).memory.ptr;
      (ctx->overlay).end = (ctx->memory).allocated;
    }
  }
  pnVar8 = ctx->begin;
  pnVar9 = pnVar8;
  while (pnVar6 = pnVar9, pnVar6 != (nk_window *)0x0) {
    nVar5 = (pnVar6->buffer).last;
    pnVar9 = pnVar6->next;
    if ((nVar5 != (pnVar6->buffer).begin) && ((pnVar6->flags & 0x1000) == 0)) {
      while( true ) {
        if (pnVar9 == (nk_window *)0x0) {
          nVar10 = (ctx->overlay).begin;
          if ((ctx->overlay).end == nVar10) {
            nVar10 = (ctx->memory).allocated;
          }
          *(nk_size *)((long)pvVar7 + nVar5 + 8) = nVar10;
          goto LAB_0011f96d;
        }
        nVar10 = (pnVar9->buffer).begin;
        if (((pnVar9->buffer).last != nVar10) && ((pnVar9->flags & 0x1000) == 0)) break;
        pnVar9 = pnVar9->next;
      }
      *(nk_size *)((long)pvVar7 + nVar5 + 8) = nVar10;
    }
  }
LAB_0011f96d:
  ctx->build = 1;
LAB_0011f977:
  if (pnVar8 == (nk_window *)0x0) {
    return (nk_command *)0x0;
  }
  while ((nVar5 = (pnVar8->buffer).begin, nVar5 == (pnVar8->buffer).end ||
         ((pnVar8->flags & 0x1000) != 0))) {
    pnVar8 = pnVar8->next;
    if (pnVar8 == (nk_window *)0x0) {
      return (nk_command *)0x0;
    }
  }
  return (nk_command *)((long)pvVar4 + nVar5);
}

Assistant:

NK_API const struct nk_command*
nk__begin(struct nk_context *ctx)
{
    struct nk_window *iter;
    nk_byte *buffer;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    if (!ctx->count) return 0;

    buffer = (nk_byte*)ctx->memory.memory.ptr;
    if (!ctx->build) {
        nk_build(ctx);
        ctx->build = nk_true;
    }

    iter = ctx->begin;
    while (iter && ((iter->buffer.begin == iter->buffer.end) || (iter->flags & NK_WINDOW_HIDDEN)))
        iter = iter->next;
    if (!iter) return 0;
    return nk_ptr_add_const(struct nk_command, buffer, iter->buffer.begin);
}